

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.cpp
# Opt level: O2

IShaderResourceVariable * __thiscall
Diligent::ShaderVariableManagerGL::GetVariable(ShaderVariableManagerGL *this,Uint32 Index)

{
  IShaderResourceVariable *pIVar1;
  Uint32 Index_local;
  ShaderVariableLocator VarLocator;
  
  Index_local = Index;
  VarLocator.Mgr = this;
  VarLocator.Index = Index;
  pIVar1 = ShaderVariableLocator::
           TryResource<Diligent::ShaderVariableManagerGL::UniformBuffBindInfo>
                     (&VarLocator,this->m_TextureOffset / 0x18);
  if ((((pIVar1 == (IShaderResourceVariable *)0x0) &&
       (pIVar1 = ShaderVariableLocator::
                 TryResource<Diligent::ShaderVariableManagerGL::TextureBindInfo>
                           (&VarLocator,
                            (Uint32)(((ulong)this->m_ImageOffset - (ulong)this->m_TextureOffset) /
                                    0x18)), pIVar1 == (IShaderResourceVariable *)0x0)) &&
      (pIVar1 = ShaderVariableLocator::TryResource<Diligent::ShaderVariableManagerGL::ImageBindInfo>
                          (&VarLocator,
                           (Uint32)(((ulong)this->m_StorageBufferOffset - (ulong)this->m_ImageOffset
                                    ) / 0x18)), pIVar1 == (IShaderResourceVariable *)0x0)) &&
     (pIVar1 = ShaderVariableLocator::
               TryResource<Diligent::ShaderVariableManagerGL::StorageBufferBindInfo>
                         (&VarLocator,
                          (Uint32)(((ulong)this->m_VariableEndOffset -
                                   (ulong)this->m_StorageBufferOffset) / 0x18)),
     pIVar1 == (IShaderResourceVariable *)0x0)) {
    pIVar1 = (IShaderResourceVariable *)0x0;
    LogError<false,unsigned_int,char[32]>
              (false,"GetVariable",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/ShaderVariableManagerGL.cpp"
               ,0x20f,&Index_local,(char (*) [32])" is not a valid variable index.");
  }
  return pIVar1;
}

Assistant:

IShaderResourceVariable* ShaderVariableManagerGL::GetVariable(Uint32 Index) const
{
    ShaderVariableLocator VarLocator(*this, Index);

    if (auto* pUB = VarLocator.TryResource<UniformBuffBindInfo>(GetNumUBs()))
        return pUB;

    if (auto* pTexture = VarLocator.TryResource<TextureBindInfo>(GetNumTextures()))
        return pTexture;

    if (auto* pImage = VarLocator.TryResource<ImageBindInfo>(GetNumImages()))
        return pImage;

    if (auto* pSSBO = VarLocator.TryResource<StorageBufferBindInfo>(GetNumStorageBuffers()))
        return pSSBO;

    LOG_ERROR(Index, " is not a valid variable index.");
    return nullptr;
}